

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<double,_1,__1,_1,_1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
lazyAssign<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>
          (PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *this,
          DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *other)

{
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *other_00;
  Matrix<double,_1,__1,_1,_1,__1> *pMVar1;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *other_local;
  PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *this_local;
  
  _resize_to_match<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>
            (this,(EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)other);
  other_00 = (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
             EigenBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::derived
                       ((EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                        other);
  pMVar1 = DenseBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
           lazyAssign<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>
                     ((DenseBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)this,other_00);
  return pMVar1;
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }